

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O0

void __thiscall diy::Direction::Direction(Direction *this,int dim,int dir)

{
  reference piVar1;
  uint in_EDX;
  int in_ESI;
  size_type in_stack_ffffffffffffff98;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  DynamicPoint<int,_4UL> *in_stack_ffffffffffffffd0;
  
  DynamicPoint<int,_4UL>::DynamicPoint
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (Coordinate)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if ((0 < in_ESI) && ((in_EDX & 1) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + -1;
  }
  if ((0 < in_ESI) && ((in_EDX & 2) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + 1;
  }
  if ((1 < in_ESI) && ((in_EDX & 4) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + -1;
  }
  if ((1 < in_ESI) && ((in_EDX & 8) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + 1;
  }
  if ((2 < in_ESI) && ((in_EDX & 0x10) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + -1;
  }
  if ((2 < in_ESI) && ((in_EDX & 0x20) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + 1;
  }
  if ((3 < in_ESI) && ((in_EDX & 0x40) != 0)) {
    in_stack_ffffffffffffffa0 =
         (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)
         itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                   (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *(int *)in_stack_ffffffffffffffa0 = *(int *)in_stack_ffffffffffffffa0 + -1;
  }
  if ((3 < in_ESI) && ((in_EDX & 0x80) != 0)) {
    piVar1 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

Direction(int dim, int dir):
                  Parent(dim)
      {
          if (dim > 0 && dir & DIY_X0) (*this)[0] -= 1;
          if (dim > 0 && dir & DIY_X1) (*this)[0] += 1;
          if (dim > 1 && dir & DIY_Y0) (*this)[1] -= 1;
          if (dim > 1 && dir & DIY_Y1) (*this)[1] += 1;
          if (dim > 2 && dir & DIY_Z0) (*this)[2] -= 1;
          if (dim > 2 && dir & DIY_Z1) (*this)[2] += 1;
          if (dim > 3 && dir & DIY_T0) (*this)[3] -= 1;
          if (dim > 3 && dir & DIY_T1) (*this)[3] += 1;
      }